

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::reduce
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  uint16_t uVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  long lVar15;
  void *pvVar16;
  long lVar17;
  void *pvVar18;
  long lVar19;
  void *pvVar20;
  void *local_90;
  
  local_90 = dst;
  switch(dt) {
  case dt_uint8:
    iVar8 = uw * nchan;
    lVar10 = (long)(sstride * 2);
    pvVar3 = (void *)((long)(vw * sstride) + (long)src);
    lVar9 = (long)nchan;
    lVar6 = (long)(nchan + sstride) + (long)src;
    lVar7 = lVar9 * 2;
    lVar11 = (long)sstride + (long)src;
    lVar17 = (long)src + lVar9;
    for (; src != pvVar3; src = (void *)((long)src + (long)iVar8 + (long)(sstride * 2 - iVar8))) {
      lVar5 = lVar17;
      pvVar2 = src;
      lVar15 = lVar6;
      lVar19 = lVar11;
      while (pvVar2 != (void *)((long)src + (long)iVar8)) {
        for (lVar4 = 0; lVar9 != lVar4; lVar4 = lVar4 + 1) {
          *(char *)((long)local_90 + lVar4) =
               (char)((uint)*(byte *)(lVar15 + lVar4) + (uint)*(byte *)(lVar19 + lVar4) +
                      (uint)*(byte *)(lVar5 + lVar4) + (uint)*(byte *)((long)pvVar2 + lVar4) >> 2);
        }
        local_90 = (void *)((long)local_90 + lVar4);
        lVar15 = lVar15 + lVar7;
        lVar19 = lVar19 + lVar7;
        lVar5 = lVar5 + lVar7;
        pvVar2 = (void *)((long)pvVar2 + lVar9 * 2);
      }
      local_90 = (void *)((long)local_90 + (long)(iVar8 / -2 + dstride));
      lVar6 = lVar6 + lVar10;
      lVar11 = lVar11 + lVar10;
      lVar17 = lVar17 + lVar10;
    }
    break;
  case dt_uint16:
    iVar8 = sstride / 2;
    pvVar3 = (void *)((long)src + (long)(vw * iVar8) * 2);
    lVar10 = (long)nchan;
    pvVar2 = (void *)((long)src + (long)(nchan + iVar8) * 2);
    lVar7 = (long)(iVar8 * 2) * 2;
    lVar17 = lVar10 * 4;
    pvVar12 = (void *)((long)src + (long)iVar8 * 2);
    pvVar13 = (void *)((long)src + lVar10 * 2);
    for (; src != pvVar3; src = (void *)((long)src + lVar7)) {
      pvVar14 = pvVar12;
      pvVar16 = pvVar2;
      pvVar20 = pvVar13;
      for (pvVar18 = src; pvVar18 != (void *)((long)src + (long)(uw * nchan) * 2);
          pvVar18 = (void *)((long)pvVar18 + lVar17)) {
        for (lVar6 = 0; lVar10 * 2 != lVar6; lVar6 = lVar6 + 2) {
          *(short *)((long)local_90 + lVar6) =
               (short)((uint)*(ushort *)((long)pvVar16 + lVar6) +
                       (uint)*(ushort *)((long)pvVar14 + lVar6) +
                       (uint)*(ushort *)((long)pvVar20 + lVar6) +
                       (uint)*(ushort *)((long)pvVar18 + lVar6) >> 2);
        }
        local_90 = (void *)((long)local_90 + lVar6);
        pvVar16 = (void *)((long)pvVar16 + lVar17);
        pvVar14 = (void *)((long)pvVar14 + lVar17);
        pvVar20 = (void *)((long)pvVar20 + lVar17);
      }
      local_90 = (void *)((long)local_90 + (long)((uw * nchan) / -2 + dstride / 2) * 2);
      pvVar2 = (void *)((long)pvVar2 + lVar7);
      pvVar12 = (void *)((long)pvVar12 + lVar7);
      pvVar13 = (void *)((long)pvVar13 + lVar7);
    }
    break;
  case dt_half:
    iVar8 = sstride / 2;
    pvVar3 = (void *)((long)src + (long)(vw * iVar8) * 2);
    lVar10 = (long)nchan;
    pvVar2 = (void *)((long)src + (long)(nchan + iVar8) * 2);
    lVar7 = (long)(iVar8 * 2) * 2;
    lVar17 = lVar10 * 4;
    pvVar12 = (void *)((long)src + (long)iVar8 * 2);
    pvVar13 = (void *)((long)src + lVar10 * 2);
    for (; src != pvVar3; src = (void *)((long)src + lVar7)) {
      pvVar14 = pvVar2;
      pvVar16 = pvVar13;
      pvVar20 = pvVar12;
      for (pvVar18 = src; pvVar18 != (void *)((long)src + (long)(uw * nchan) * 2);
          pvVar18 = (void *)((long)pvVar18 + lVar17)) {
        for (lVar6 = 0; lVar10 * 2 != lVar6; lVar6 = lVar6 + 2) {
          uVar1 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable +
                                                 (ulong)*(ushort *)((long)pvVar18 + lVar6) * 4) +
                                       *(float *)(PtexHalf::h2fTable +
                                                 (ulong)*(ushort *)((long)pvVar16 + lVar6) * 4) +
                                       *(float *)(PtexHalf::h2fTable +
                                                 (ulong)*(ushort *)((long)pvVar20 + lVar6) * 4) +
                                      *(float *)(PtexHalf::h2fTable +
                                                (ulong)*(ushort *)((long)pvVar14 + lVar6) * 4)) *
                                      0.25);
          *(uint16_t *)((long)local_90 + lVar6) = uVar1;
        }
        local_90 = (void *)((long)local_90 + lVar6);
        pvVar14 = (void *)((long)pvVar14 + lVar17);
        pvVar20 = (void *)((long)pvVar20 + lVar17);
        pvVar16 = (void *)((long)pvVar16 + lVar17);
      }
      local_90 = (void *)((long)local_90 + (long)((uw * nchan) / -2 + dstride / 2) * 2);
      pvVar2 = (void *)((long)pvVar2 + lVar7);
      pvVar12 = (void *)((long)pvVar12 + lVar7);
      pvVar13 = (void *)((long)pvVar13 + lVar7);
    }
    break;
  case dt_float:
    iVar8 = sstride / 4;
    pvVar3 = (void *)((long)src + (long)(vw * iVar8) * 4);
    lVar7 = (long)nchan;
    pvVar2 = (void *)((long)src + (long)(nchan + iVar8) * 4);
    lVar10 = (long)(iVar8 * 2) * 4;
    lVar17 = lVar7 * 8;
    pvVar12 = (void *)((long)src + (long)iVar8 * 4);
    pvVar13 = (void *)((long)src + lVar7 * 4);
    for (; src != pvVar3; src = (void *)((long)src + lVar10)) {
      pvVar14 = pvVar12;
      pvVar16 = pvVar2;
      pvVar20 = pvVar13;
      for (pvVar18 = src; pvVar18 != (void *)((long)src + (long)(uw * nchan) * 4);
          pvVar18 = (void *)((long)pvVar18 + lVar17)) {
        for (lVar6 = 0; lVar7 * 4 != lVar6; lVar6 = lVar6 + 4) {
          *(float *)((long)local_90 + lVar6) =
               (*(float *)((long)pvVar18 + lVar6) + *(float *)((long)pvVar20 + lVar6) +
                *(float *)((long)pvVar14 + lVar6) + *(float *)((long)pvVar16 + lVar6)) * 0.25;
        }
        local_90 = (void *)((long)local_90 + lVar6);
        pvVar16 = (void *)((long)pvVar16 + lVar17);
        pvVar14 = (void *)((long)pvVar14 + lVar17);
        pvVar20 = (void *)((long)pvVar20 + lVar17);
      }
      local_90 = (void *)((long)local_90 + (long)((uw * nchan) / -2 + dstride / 4) * 4);
      pvVar2 = (void *)((long)pvVar2 + lVar10);
      pvVar12 = (void *)((long)pvVar12 + lVar10);
      pvVar13 = (void *)((long)pvVar13 + lVar10);
    }
  }
  return;
}

Assistant:

void reduce(const void* src, int sstride, int uw, int vw,
            void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduce(static_cast<const uint8_t*>(src), sstride, uw, vw,
                              static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduce(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                              static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduce(static_cast<const uint16_t*>(src), sstride, uw, vw,
                              static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduce(static_cast<const float*>(src), sstride, uw, vw,
                              static_cast<float*>(dst), dstride, nchan); break;
    }
}